

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

bool __thiscall AllDiffDomain<4>::check(AllDiffDomain<4> *this)

{
  IntView<4> *this_00;
  int64_t iVar1;
  long in_RDI;
  ulong uVar2;
  int i_1;
  int i;
  bool *taken;
  IntView<4> *in_stack_ffffffffffffffc0;
  int local_20;
  int local_1c;
  
  if (*(int *)(in_RDI + 0x20) != 0) {
    uVar2 = (ulong)*(int *)(in_RDI + 0x20);
    if ((long)uVar2 < 0) {
      uVar2 = 0xffffffffffffffff;
    }
    this_00 = (IntView<4> *)operator_new__(uVar2);
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x20); local_1c = local_1c + 1) {
      *(undefined1 *)((long)&this_00->var + (long)local_1c) = 0;
    }
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x20); local_20 = local_20 + 1) {
      iVar1 = IntView<4>::getShadowVal(in_stack_ffffffffffffffc0);
      if ((*(byte *)((long)&this_00->var + iVar1) & 1) != 0) {
        if (this_00 != (IntView<4> *)0x0) {
          operator_delete__(this_00);
        }
        return false;
      }
      in_stack_ffffffffffffffc0 = this_00;
      iVar1 = IntView<4>::getShadowVal(this_00);
      *(undefined1 *)((long)&in_stack_ffffffffffffffc0->var + iVar1) = 1;
    }
    if (this_00 != (IntView<4> *)0x0) {
      operator_delete__(this_00);
    }
  }
  return true;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}